

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v3_utl.cc
# Opt level: O2

ASN1_INTEGER * s2i_ASN1_INTEGER(X509V3_EXT_METHOD *meth,char *value)

{
  byte *pbVar1;
  char cVar2;
  int iVar3;
  BIGNUM *in_RAX;
  BIGNUM *a;
  size_t sVar4;
  ASN1_INTEGER *pAVar5;
  char *__s;
  int line;
  bool bVar6;
  BIGNUM *local_28;
  
  if (value == (char *)0x0) {
    iVar3 = 0x7e;
    line = 0xb7;
    local_28 = in_RAX;
  }
  else {
    a = BN_new();
    cVar2 = *value;
    __s = value + (cVar2 == '-');
    local_28 = a;
    if ((value[cVar2 == '-'] == '0') && ((byte)(__s[1] | 0x20U) == 0x78)) {
      __s = __s + 2;
      iVar3 = BN_hex2bn(&local_28,__s);
    }
    else {
      sVar4 = strlen(__s);
      if (0x2000 < sVar4) {
        BN_free(a);
        iVar3 = 0x7f;
        line = 0xd3;
        goto LAB_002048d8;
      }
      iVar3 = BN_dec2bn(&local_28,__s);
    }
    if ((iVar3 == 0) || (__s[iVar3] != '\0')) {
      BN_free(local_28);
      iVar3 = 0x66;
      line = 0xdb;
    }
    else {
      bVar6 = true;
      if (cVar2 == '-') {
        iVar3 = BN_is_zero((BIGNUM *)local_28);
        bVar6 = iVar3 != 0;
      }
      pAVar5 = BN_to_ASN1_INTEGER(local_28,(ASN1_INTEGER *)0x0);
      BN_free(local_28);
      if (pAVar5 != (ASN1_INTEGER *)0x0) {
        if (bVar6) {
          return pAVar5;
        }
        pbVar1 = (byte *)((long)&pAVar5->type + 1);
        *pbVar1 = *pbVar1 | 1;
        return pAVar5;
      }
      iVar3 = 0x67;
      line = 0xe6;
    }
  }
LAB_002048d8:
  ERR_put_error(0x14,0,iVar3,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/x509/v3_utl.cc"
                ,line);
  return (ASN1_INTEGER *)0x0;
}

Assistant:

ASN1_INTEGER *s2i_ASN1_INTEGER(const X509V3_EXT_METHOD *method,
                               const char *value) {
  BIGNUM *bn = NULL;
  ASN1_INTEGER *aint;
  int isneg, ishex;
  int ret;
  if (!value) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NULL_VALUE);
    return 0;
  }
  bn = BN_new();
  if (value[0] == '-') {
    value++;
    isneg = 1;
  } else {
    isneg = 0;
  }

  if (value[0] == '0' && ((value[1] == 'x') || (value[1] == 'X'))) {
    value += 2;
    ishex = 1;
  } else {
    ishex = 0;
  }

  if (ishex) {
    ret = BN_hex2bn(&bn, value);
  } else {
    // Decoding from decimal scales quadratically in the input length. Bound the
    // largest decimal input we accept in the config parser. 8,192 decimal
    // digits allows values up to 27,213 bits. Ths exceeds the largest RSA, DSA,
    // or DH modulus we support, and those are not usefully represented in
    // decimal.
    if (strlen(value) > 8192) {
      BN_free(bn);
      OPENSSL_PUT_ERROR(X509V3, X509V3_R_INVALID_NUMBER);
      return 0;
    }
    ret = BN_dec2bn(&bn, value);
  }

  if (!ret || value[ret]) {
    BN_free(bn);
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_BN_DEC2BN_ERROR);
    return 0;
  }

  if (isneg && BN_is_zero(bn)) {
    isneg = 0;
  }

  aint = BN_to_ASN1_INTEGER(bn, NULL);
  BN_free(bn);
  if (!aint) {
    OPENSSL_PUT_ERROR(X509V3, X509V3_R_BN_TO_ASN1_INTEGER_ERROR);
    return 0;
  }
  if (isneg) {
    aint->type |= V_ASN1_NEG;
  }
  return aint;
}